

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_move_from_ccr(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 ea_result;
  TCGv_i32 ccr;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  pTVar1 = s->uc->tcg_ctx;
  pTVar2 = gen_get_ccr(s);
  pTVar2 = gen_ea(env,s,insn,1,pTVar2,(TCGv_i32 *)0x0,EA_STORE,
                  (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (pTVar2 == pTVar1->NULL_QREG) {
    gen_addr_fault(s);
  }
  return;
}

Assistant:

DISAS_INSN(move_from_ccr)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv ccr;

    ccr = gen_get_ccr(s);
    DEST_EA(env, insn, OS_WORD, ccr, NULL);
}